

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_SetButcherTable(ARKodeMem ark_mem)

{
  void *pvVar1;
  undefined8 *puVar2;
  uint uVar3;
  ARKodeButcherTable B;
  int iVar4;
  ARKODE_ERKTableID imethod;
  sunindextype Blrw;
  sunindextype Bliw;
  int local_30;
  int local_2c;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar4 = -0x15;
    arkProcessError(ark_mem,-0x15,"ARKode::ERKStep","erkStep_SetButcherTable",
                    "Time step module memory is NULL.");
  }
  else {
    iVar4 = 0;
    if (*(long *)((long)pvVar1 + 0x20) == 0) {
      uVar3 = *(int *)((long)pvVar1 + 0x10) - 2;
      if (uVar3 < 7) {
        imethod = *(ARKODE_ERKTableID *)(&DAT_0076889c + (ulong)uVar3 * 4);
      }
      else {
        arkProcessError(ark_mem,-0x16,"ARKode::ERKStep","erkStep_SetButcherTable",
                        "No explicit method at requested order, using q=6.");
        imethod = ARKODE_VERNER_8_5_6;
      }
      B = ARKodeButcherTable_LoadERK(imethod);
      *(ARKodeButcherTable *)((long)pvVar1 + 0x20) = B;
      ARKodeButcherTable_Space(B,&local_2c,&local_30);
      ark_mem->liw = ark_mem->liw + (long)local_2c;
      ark_mem->lrw = ark_mem->lrw + (long)local_30;
      puVar2 = *(undefined8 **)((long)pvVar1 + 0x20);
      iVar4 = 0;
      if (puVar2 != (undefined8 *)0x0) {
        *(undefined4 *)((long)pvVar1 + 0x18) = *(undefined4 *)(puVar2 + 1);
        *(undefined8 *)((long)pvVar1 + 0x10) = *puVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

int erkStep_SetButcherTable(ARKodeMem ark_mem)
{
  int etable;
  ARKodeERKStepMem step_mem;
  sunindextype Bliw, Blrw;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "erkStep_SetButcherTable", MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem) ark_mem->step_mem;

  /* if table has already been specified, just return */
  if (step_mem->B != NULL)
    return(ARK_SUCCESS);

  /* initialize table number to illegal values */
  etable = -1;

  /* select method based on order */
  switch (step_mem->q) {
  case(2):
    etable = ERKSTEP_DEFAULT_2;
    break;
  case(3):
    etable = ERKSTEP_DEFAULT_3;
    break;
  case(4):
    etable = ERKSTEP_DEFAULT_4;
    break;
  case(5):
    etable = ERKSTEP_DEFAULT_5;
    break;
  case(6):
    etable = ERKSTEP_DEFAULT_6;
    break;
  case(7):
  case(8):
    etable = ERKSTEP_DEFAULT_8;
    break;
  default:    /* no available method, set default */
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "erkStep_SetButcherTable",
                    "No explicit method at requested order, using q=6.");
    etable = ERKSTEP_DEFAULT_6;
    break;
  }

  if (etable > -1)
    step_mem->B = ARKodeButcherTable_LoadERK(etable);

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] stored values for stage numbers and method orders */
  if (step_mem->B != NULL) {
    step_mem->stages = step_mem->B->stages;
    step_mem->q = step_mem->B->q;
    step_mem->p = step_mem->B->p;
  }

  return(ARK_SUCCESS);
}